

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tr1_failurecount_assertion_tests.cpp
# Opt level: O0

void __thiscall
iu_FailureCountTest_x_iutest_x_Fail_Test::Body(iu_FailureCountTest_x_iutest_x_Fail_Test *this)

{
  bool bVar1;
  char *message;
  AssertionHelper local_208;
  Fixed local_1d8;
  anon_class_1_0_00000001 local_39;
  undefined1 local_38 [8];
  AssertionResult iutest_spi_ar;
  iu_FailureCountTest_x_iutest_x_Fail_Test *this_local;
  
  iutest_spi_ar._32_8_ = this;
  iutest::detail::AlwaysZero();
  Body::anon_class_1_0_00000001::operator()((AssertionResult *)local_38,&local_39);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    memset(&local_1d8,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_1d8);
    message = iutest::AssertionResult::message((AssertionResult *)local_38);
    iutest::AssertionHelper::AssertionHelper
              (&local_208,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/tr1_failurecount_assertion_tests.cpp"
               ,0x27,message,kNonFatalFailure);
    iutest::AssertionHelper::operator=(&local_208,&local_1d8);
    iutest::AssertionHelper::~AssertionHelper(&local_208);
    iutest::AssertionHelper::Fixed::~Fixed(&local_1d8);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  return;
}

Assistant:

IUTEST(FailureCountTest, Fail)
{
    IUTEST_EXPECT_FATAL_FAILURE(
        IUTEST_ASSERT_FAILURECOUNT_LT(IUTEST_EXPECT_EQ(f(), 1); IUTEST_EXPECT_EQ(f(), 0), 2)
        , "failure count less than 2");
}